

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketInitiator.cpp
# Opt level: O1

void __thiscall
FIX::SocketInitiator::onConnect(SocketInitiator *this,SocketConnector *param_1,socket_handle s)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  SocketConnection *this_00;
  mapped_type *ppSVar3;
  _Base_ptr p_Var4;
  iterator __position;
  key_type local_24;
  
  p_Var1 = &(this->m_pendingConnections)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->m_pendingConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < s]) {
    if (s <= (int)p_Var2[1]._M_color) {
      p_Var4 = p_Var2;
    }
  }
  __position._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (__position._M_node = p_Var4, s < (int)p_Var4[1]._M_color)) {
    __position._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    this_00 = (SocketConnection *)__position._M_node[1]._M_parent;
    ppSVar3 = std::
              map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
              ::operator[](&this->m_connections,&local_24);
    *ppSVar3 = this_00;
    std::
    _Rb_tree<int,std::pair<int_const,FIX::SocketConnection*>,std::_Select1st<std::pair<int_const,FIX::SocketConnection*>>,std::less<int>,std::allocator<std::pair<int_const,FIX::SocketConnection*>>>
    ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,FIX::SocketConnection*>,std::_Select1st<std::pair<int_const,FIX::SocketConnection*>>,std::less<int>,std::allocator<std::pair<int_const,FIX::SocketConnection*>>>
                        *)&this->m_pendingConnections,__position);
    Initiator::setConnected(&this->super_Initiator,&this_00->m_pSession->m_sessionID);
    SocketConnection::onTimeout(this_00);
  }
  return;
}

Assistant:

void SocketInitiator::onConnect(SocketConnector &, socket_handle s) {
  SocketConnections::iterator i = m_pendingConnections.find(s);
  if (i == m_pendingConnections.end()) {
    return;
  }
  SocketConnection *pSocketConnection = i->second;

  m_connections[s] = pSocketConnection;
  m_pendingConnections.erase(i);
  setConnected(pSocketConnection->getSession()->getSessionID());
  pSocketConnection->onTimeout();
}